

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_int>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
     ::transfer_slot_fn(void *set,void *dst,void *src)

{
  size_t c;
  
  c = *set;
  *(undefined8 *)set = 0xffffffffffffff9c;
  *(undefined8 *)dst = *src;
  *(undefined8 *)((long)dst + 8) = *(undefined8 *)((long)src + 8);
  *(undefined8 *)((long)dst + 0x10) = *(undefined8 *)((long)src + 0x10);
  *(undefined8 *)src = 0;
  *(undefined8 *)((long)src + 8) = 0;
  *(undefined8 *)((long)src + 0x10) = 0;
  *(undefined4 *)((long)dst + 0x18) = *(undefined4 *)((long)src + 0x18);
  CommonFields::set_capacity((CommonFields *)set,c);
  return;
}

Assistant:

void set_capacity(size_t c) {
    // We allow setting above the max valid capacity for debugging purposes.
    ABSL_SWISSTABLE_ASSERT(c == 0 || IsValidCapacity(c) ||
                           c > kAboveMaxValidCapacity);
    capacity_ = c;
  }